

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ibuf.c
# Opt level: O0

void test_ibuf_basic(void)

{
  size_t sVar1;
  void *pvVar2;
  void *ptr;
  ibuf ibuf;
  
  plan(6);
  _space(_stdout);
  printf("# *** %s ***\n","test_ibuf_basic");
  ibuf_create((ibuf *)&ptr,&cache,0x3fc0);
  sVar1 = ibuf_used((ibuf *)&ptr);
  _ok((uint)(sVar1 == 0),"ibuf_used(&ibuf) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x14,
      "line %d");
  pvVar2 = ibuf_alloc((ibuf *)&ptr,10);
  _ok((uint)(pvVar2 != (void *)0x0),"ptr != NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x16,
      "line %d");
  sVar1 = ibuf_used((ibuf *)&ptr);
  _ok((uint)(sVar1 == 10),"ibuf_used(&ibuf) == 10",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x17,
      "line %d");
  pvVar2 = ibuf_alloc((ibuf *)&ptr,1000000);
  _ok((uint)(pvVar2 != (void *)0x0),"ptr != NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x1a,
      "line %d");
  sVar1 = ibuf_used((ibuf *)&ptr);
  _ok((uint)(sVar1 == 0xf424a),"ibuf_used(&ibuf) == 1000010",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x1b,
      "line %d");
  ibuf_reset((ibuf *)&ptr);
  sVar1 = ibuf_used((ibuf *)&ptr);
  _ok((uint)(sVar1 == 0),"ibuf_used(&ibuf) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0x1e,
      "line %d");
  ibuf_destroy((ibuf *)&ptr);
  _space(_stdout);
  printf("# *** %s: done ***\n","test_ibuf_basic");
  check_plan();
  return;
}

Assistant:

static void
test_ibuf_basic(void)
{
	plan(6);
	header();

	struct ibuf ibuf;
	ibuf_create(&ibuf, &cache, 16320);
	ok(ibuf_used(&ibuf) == 0);
	void *ptr = ibuf_alloc(&ibuf, 10);
	ok(ptr != NULL);
	ok(ibuf_used(&ibuf) == 10);

	ptr = ibuf_alloc(&ibuf, 1000000);
	ok(ptr != NULL);
	ok(ibuf_used(&ibuf) == 1000010);

	ibuf_reset(&ibuf);
	ok(ibuf_used(&ibuf) == 0);
	ibuf_destroy(&ibuf);

	footer();
	check_plan();
}